

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O1

string * __thiscall
units::getCommodityName_abi_cxx11_(string *__return_storage_ptr__,units *this,uint32_t commodity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  __hash_code __code;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint uVar11;
  ulong uVar12;
  uint __val;
  ulong uVar13;
  undefined8 uVar14;
  long *plVar15;
  long *plVar16;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __val = (uint)this;
  uVar13 = (ulong)this & 0xffffffff;
  if (((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) && (_DAT_004fd9d8 != 0)) {
    uVar12 = ((ulong)this & 0xffffffff) % _DAT_004fd9c8;
    plVar15 = *(long **)(customCommodityNames_abi_cxx11_ + uVar12 * 8);
    plVar16 = (long *)0x0;
    if ((plVar15 != (long *)0x0) &&
       (plVar3 = (long *)*plVar15, plVar16 = plVar15, *(uint *)((long *)*plVar15 + 1) != __val)) {
      while (plVar15 = plVar3, plVar3 = (long *)*plVar15, plVar3 != (long *)0x0) {
        plVar16 = (long *)0x0;
        if (((ulong)*(uint *)(plVar3 + 1) % _DAT_004fd9c8 != uVar12) ||
           (plVar16 = plVar15, *(uint *)(plVar3 + 1) == __val)) goto LAB_003bbdfd;
      }
      plVar16 = (long *)0x0;
    }
LAB_003bbdfd:
    if (plVar16 == (long *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = *plVar16;
    }
    if (lVar8 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(lVar8 + 0x10),
                 *(long *)(lVar8 + 0x18) + *(long *)(lVar8 + 0x10));
      return __return_storage_ptr__;
    }
  }
  uVar12 = ((ulong)this & 0xffffffff) % DAT_004fd920;
  plVar15 = *(long **)(commodities::commodity_names + uVar12 * 8);
  plVar16 = (long *)0x0;
  if ((plVar15 != (long *)0x0) &&
     (plVar3 = (long *)*plVar15, plVar16 = plVar15, *(uint *)((long *)*plVar15 + 1) != __val)) {
    while (plVar15 = plVar3, plVar3 = (long *)*plVar15, plVar3 != (long *)0x0) {
      plVar16 = (long *)0x0;
      if (((ulong)*(uint *)(plVar3 + 1) % DAT_004fd920 != uVar12) ||
         (plVar16 = plVar15, *(uint *)(plVar3 + 1) == __val)) goto LAB_003bbe89;
    }
    plVar16 = (long *)0x0;
  }
LAB_003bbe89:
  if (plVar16 == (long *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = *plVar16;
  }
  if (lVar8 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,*(char **)(lVar8 + 0x10),
               (allocator<char> *)&local_88);
    return __return_storage_ptr__;
  }
  if ((__val & 0x7c000000) == 0x40000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,((byte)uVar13 & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,((byte)(uVar13 >> 5) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,((byte)(uVar13 >> 10) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,((byte)(uVar13 >> 0xf) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,((byte)(__val >> 0x14) & 0x1f) + 0x5f);
    while( true ) {
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != '_') break;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CXCOMM[","");
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = 4;
    do {
      uVar7 = uVar6;
      uVar11 = (uint)uVar13;
      if (uVar11 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_003bbfd6;
      }
      if (uVar11 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_003bbfd6;
      }
      if (uVar11 < 10000) goto LAB_003bbfd6;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar7 + 4;
    } while (99999 < uVar11);
    uVar7 = uVar7 + 1;
  }
LAB_003bbfd6:
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_68,(ulong)uVar7,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68._M_dataplus._M_p,(uint)local_68._M_string_length,__val);
  uVar13 = CONCAT44(local_68._M_string_length._4_4_,(uint)local_68._M_string_length) +
           local_48._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    uVar14 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar13) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      uVar14 = local_68.field_2._M_allocated_capacity;
    }
    if (uVar13 <= (ulong)uVar14) {
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_68,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
      goto LAB_003bc05a;
    }
  }
  pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_48,local_68._M_dataplus._M_p,
                     CONCAT44(local_68._M_string_length._4_4_,(uint)local_68._M_string_length));
LAB_003bc05a:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if (paVar4 == paVar10) {
    local_88.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_88._M_dataplus._M_p = (pointer)paVar4;
  }
  local_88._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_88,"]");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar10) {
    uVar14 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar14;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}